

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O2

pair<std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
* __thiscall
spvtools::opt::LoopFusion::GetLoadsAndStoresInLoop
          (pair<std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
           *__return_storage_ptr__,LoopFusion *this,Loop *loop)

{
  BasicBlock *pBVar1;
  Instruction *pIVar2;
  size_type sVar3;
  pair<std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  *ppVar4;
  uint32_t uVar5;
  vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *this_00;
  Instruction *instruction;
  Instruction **ppIVar6;
  __node_base *p_Var7;
  iterator iVar8;
  Instruction *local_88;
  pair<std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  *local_80;
  LoopFusion *local_78;
  Loop *local_70;
  _Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_68
  ;
  _Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_48
  ;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var7 = &(loop->loop_basic_blocks_)._M_h._M_before_begin;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80 = __return_storage_ptr__;
  local_78 = this;
  local_70 = loop;
  while (ppVar4 = local_80, p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
    sVar3 = *(size_type *)(p_Var7 + 1);
    uVar5 = BasicBlock::id(loop->loop_continue_);
    if ((uint32_t)sVar3 != uVar5) {
      iVar8 = opt::Function::FindBlock(local_78->containing_function_,(uint32_t)sVar3);
      pBVar1 = ((iVar8.iterator_._M_current._M_current)->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      ppIVar6 = (Instruction **)
                ((long)&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
      while (pIVar2 = *ppIVar6, loop = local_70,
            pIVar2 != (Instruction *)
                      ((long)&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 8U)
            ) {
        this_00 = (vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *
                  )&local_68;
        if ((pIVar2->opcode_ == OpStore) ||
           (this_00 = (vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                       *)&local_48, pIVar2->opcode_ == OpLoad)) {
          local_88 = pIVar2;
          std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
          emplace_back<spvtools::opt::Instruction*>(this_00,&local_88);
        }
        ppIVar6 = &(pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      }
    }
  }
  std::
  pair<std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  ::
  pair<std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_&,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_&,_true>
            (local_80,(vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                       *)&local_48,
             (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &local_68);
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&local_68);
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&local_48);
  return ppVar4;
}

Assistant:

std::pair<std::vector<Instruction*>, std::vector<Instruction*>>
LoopFusion::GetLoadsAndStoresInLoop(Loop* loop) {
  std::vector<Instruction*> loads{};
  std::vector<Instruction*> stores{};

  for (auto block_id : loop->GetBlocks()) {
    if (block_id == loop->GetContinueBlock()->id()) {
      continue;
    }

    for (auto& instruction : *containing_function_->FindBlock(block_id)) {
      if (instruction.opcode() == spv::Op::OpLoad) {
        loads.push_back(&instruction);
      } else if (instruction.opcode() == spv::Op::OpStore) {
        stores.push_back(&instruction);
      }
    }
  }

  return std::make_pair(loads, stores);
}